

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O1

size_t spdlog::details::os::thread_id(void)

{
  long in_FS_OFFSET;
  
  if (*(char *)(in_FS_OFFSET + -8) == '\0') {
    thread_id();
  }
  return *(size_t *)(in_FS_OFFSET + -0x10);
}

Assistant:

SPDLOG_INLINE size_t thread_id() SPDLOG_NOEXCEPT
{
#if defined(SPDLOG_NO_TLS)
    return _thread_id();
#else // cache thread id in tls
    static thread_local const size_t tid = _thread_id();
    return tid;
#endif
}